

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O0

obj * get_mleash(monst *mtmp)

{
  obj *local_20;
  obj *otmp;
  monst *mtmp_local;
  
  local_20 = invent;
  while( true ) {
    if (local_20 == (obj *)0x0) {
      return (obj *)0x0;
    }
    if ((local_20->otyp == 0xf1) && (local_20->corpsenm == mtmp->m_id)) break;
    local_20 = local_20->nobj;
  }
  return local_20;
}

Assistant:

struct obj *get_mleash(struct monst *mtmp)	/* assuming mtmp->mleashed has been checked */
{
	struct obj *otmp;

	otmp = invent;
	while (otmp) {
		if (otmp->otyp == LEASH && otmp->leashmon == (int)mtmp->m_id)
			return otmp;
		otmp = otmp->nobj;
	}
	return NULL;
}